

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_wraith.cpp
# Opt level: O0

int AF_A_WraithMelee(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *inflictor;
  int iVar1;
  AActor *target;
  bool bVar2;
  bool local_5e;
  bool local_5b;
  TAngle<double> local_58;
  FName local_50;
  int local_4c;
  void *pvStack_48;
  int amount;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_18;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pVStack_18 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_wraith.cpp"
                  ,0x5b,"int AF_A_WraithMelee(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar2) {
    stateowner = (AActor *)(param->field_0).field_1.a;
    local_5b = true;
    if (stateowner != (AActor *)0x0) {
      local_5b = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
    }
    if (local_5b == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_wraith.cpp"
                    ,0x5b,"int AF_A_WraithMelee(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_18[(int)self].field_0.field_3.Type != 0xff)) {
      bVar2 = false;
      if ((pVStack_18[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar2 = true, pVStack_18[(int)self].field_0.field_1.atag != 1)) {
        bVar2 = pVStack_18[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar2) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_wraith.cpp"
                      ,0x5b,"int AF_A_WraithMelee(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
      stateinfo = (FStateParamInfo *)pVStack_18[(int)self].field_0.field_1.a;
      local_5e = true;
      if ((DObject *)stateinfo != (DObject *)0x0) {
        local_5e = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
      }
      if (local_5e == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_wraith.cpp"
                      ,0x5b,"int AF_A_WraithMelee(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
    }
    else {
      stateinfo = (FStateParamInfo *)stateowner;
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_18[(int)self].field_0.field_3.Type != 0xff)) {
      bVar2 = false;
      if ((pVStack_18[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar2 = true, pVStack_18[(int)self].field_0.field_1.atag != 8)) {
        bVar2 = pVStack_18[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar2) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_wraith.cpp"
                      ,0x5b,"int AF_A_WraithMelee(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
      pvStack_48 = pVStack_18[(int)self].field_0.field_1.a;
    }
    else {
      pvStack_48 = (void *)0x0;
    }
    bVar2 = AActor::CheckMeleeRange(stateowner);
    if ((bVar2) && (iVar1 = FRandom::operator()(&pr_stealhealth), iVar1 < 0xdc)) {
      local_4c = FRandom::HitDice(&pr_stealhealth,2);
      target = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&stateowner->target);
      inflictor = stateowner;
      iVar1 = local_4c;
      FName::FName(&local_50,NAME_Melee);
      TAngle<double>::TAngle(&local_58,0.0);
      P_DamageMobj(target,inflictor,inflictor,iVar1,&local_50,0,&local_58);
      stateowner->health = local_4c + stateowner->health;
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_wraith.cpp"
                ,0x5b,"int AF_A_WraithMelee(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_WraithMelee)
{
	PARAM_ACTION_PROLOGUE;

	int amount;

	// Steal health from target and give to self
	if (self->CheckMeleeRange() && (pr_stealhealth()<220))
	{
		amount = pr_stealhealth.HitDice (2);
		P_DamageMobj (self->target, self, self, amount, NAME_Melee);
		self->health += amount;
	}
	return 0;
}